

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::AddSymbol
          (DescriptorIndex *this,StringPiece symbol)

{
  set<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  byte bVar2;
  SymbolEntry *pSVar3;
  undefined1 *puVar4;
  StringPiece sub_symbol;
  StringPiece sub_symbol_00;
  StringPiece super_symbol;
  StringPiece super_symbol_00;
  StringPiece super_symbol_01;
  StringPiece super_symbol_02;
  string *psVar5;
  _Alloc_hider _Var6;
  size_type sVar7;
  bool bVar8;
  const_iterator __position;
  LogMessage *pLVar9;
  __normal_iterator<const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>_>
  _Var10;
  char *pcVar11;
  __normal_iterator<const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>_>
  this_01;
  char *pcVar12;
  SymbolEntry *this_02;
  _Base_ptr p_Var13;
  bool bVar14;
  StringPiece sub_symbol_01;
  StringPiece sub_symbol_02;
  _Alloc_node __an;
  string entry_as_string;
  SymbolEntry entry;
  LogFinisher local_131;
  undefined1 local_130 [56];
  string local_f8;
  StringPiece local_d8;
  char *local_c8;
  string local_c0;
  char *local_a0;
  string local_98;
  string local_78;
  SymbolEntry local_58;
  
  pcVar12 = (char *)symbol.length_;
  local_58.data_offset =
       (int)((ulong)((long)(this->all_values_).
                           super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->all_values_).
                          super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 + -1;
  local_130._0_8_ =
       (set<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
        *)symbol.ptr_;
  local_130._8_8_ = pcVar12;
  stringpiece_internal::StringPiece::ToString_abi_cxx11_
            (&local_58.encoded_symbol,(StringPiece *)local_130);
  SymbolEntry::AsString_abi_cxx11_(&local_98,&local_58,this);
  bVar14 = pcVar12 == (char *)0x0;
  if (!bVar14) {
    pcVar11 = (char *)0x0;
    do {
      bVar2 = pcVar11[(long)&((set<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
                               *)symbol.ptr_)->_M_t];
      if ((((bVar2 != 0x2e) && (bVar2 != 0x5f)) && ((byte)(bVar2 - 0x3a) < 0xf6)) &&
         ((byte)((bVar2 & 0xdf) + 0xa5) < 0xe6)) break;
      pcVar11 = pcVar11 + 1;
      bVar14 = pcVar12 == pcVar11;
    } while (!bVar14);
  }
  if (bVar14) {
    this_00 = &this->by_symbol_;
    p_Var13 = (this->by_symbol_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var1 = &(this->by_symbol_)._M_t._M_impl.super__Rb_tree_header;
    __position._M_node = &p_Var1->_M_header;
    if (p_Var13 != (_Base_ptr)0x0) {
      do {
        bVar14 = SymbolCompare::operator()
                           ((SymbolCompare *)this_00,&local_58,(SymbolEntry *)(p_Var13 + 1));
        if (bVar14) {
          __position._M_node = p_Var13;
        }
        p_Var13 = (&p_Var13->_M_left)[!bVar14];
      } while (p_Var13 != (_Base_ptr)0x0);
    }
    if (__position._M_node !=
        (this->by_symbol_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
      __position._M_node = (_Base_ptr)std::_Rb_tree_decrement(__position._M_node);
    }
    sVar7 = local_98._M_string_length;
    _Var6._M_p = local_98._M_dataplus._M_p;
    if ((long)local_98._M_string_length < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig
                (local_98._M_string_length,"string length exceeds max size");
    }
    local_c0._M_dataplus._M_p = _Var6._M_p;
    local_c0._M_string_length = sVar7;
    bVar14 = true;
    if ((_Rb_tree_header *)__position._M_node != p_Var1) {
      SymbolEntry::AsString_abi_cxx11_
                ((string *)local_130,(SymbolEntry *)(__position._M_node + 1),this);
      sub_symbol.length_ = local_130._8_8_;
      sub_symbol.ptr_ = (char *)local_130._0_8_;
      if ((long)local_130._8_8_ < 0) {
        stringpiece_internal::StringPiece::LogFatalSizeTooBig
                  (local_130._8_8_,"string length exceeds max size");
      }
      super_symbol_01.length_ = local_c0._M_string_length;
      super_symbol_01.ptr_ = local_c0._M_dataplus._M_p;
      bVar8 = anon_unknown_31::IsSubSymbol(sub_symbol,super_symbol_01);
      if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
        operator_delete((void *)local_130._0_8_);
      }
      if (bVar8) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_130,LOGLEVEL_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
                   ,0x29c);
        pLVar9 = internal::LogMessage::operator<<((LogMessage *)local_130,"Symbol name \"");
        pLVar9 = internal::LogMessage::operator<<(pLVar9,(StringPiece *)&local_c0);
        pLVar9 = internal::LogMessage::operator<<(pLVar9,"\" conflicts with the existing symbol \"")
        ;
        SymbolEntry::AsString_abi_cxx11_(&local_f8,(SymbolEntry *)(__position._M_node + 1),this);
        pLVar9 = internal::LogMessage::operator<<(pLVar9,&local_f8);
        pLVar9 = internal::LogMessage::operator<<(pLVar9,"\".");
        internal::LogFinisher::operator=((LogFinisher *)&local_78,pLVar9);
      }
      else {
        __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        _Var6._M_p = local_c0._M_dataplus._M_p;
        if ((_Rb_tree_header *)__position._M_node == p_Var1) {
          bVar8 = false;
        }
        else {
          local_c8 = (char *)local_c0._M_string_length;
          SymbolEntry::AsString_abi_cxx11_(&local_78,(SymbolEntry *)(__position._M_node + 1),this);
          super_symbol_02.length_ = local_78._M_string_length;
          super_symbol_02.ptr_ = local_78._M_dataplus._M_p;
          if ((long)local_78._M_string_length < 0) {
            stringpiece_internal::StringPiece::LogFatalSizeTooBig
                      (local_78._M_string_length,"string length exceeds max size");
          }
          sub_symbol_01.length_ = (size_type)local_c8;
          sub_symbol_01.ptr_ = _Var6._M_p;
          bVar8 = anon_unknown_31::IsSubSymbol(sub_symbol_01,super_symbol_02);
        }
        if (((_Rb_tree_header *)__position._M_node != p_Var1) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2)) {
          operator_delete(local_78._M_dataplus._M_p);
        }
        if (bVar8 == false) goto LAB_0038b23e;
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_130,LOGLEVEL_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
                   ,0x2aa);
        pLVar9 = internal::LogMessage::operator<<((LogMessage *)local_130,"Symbol name \"");
        pLVar9 = internal::LogMessage::operator<<(pLVar9,(StringPiece *)&local_c0);
        pLVar9 = internal::LogMessage::operator<<(pLVar9,"\" conflicts with the existing symbol \"")
        ;
        SymbolEntry::AsString_abi_cxx11_(&local_f8,(SymbolEntry *)(__position._M_node + 1),this);
        pLVar9 = internal::LogMessage::operator<<(pLVar9,&local_f8);
        pLVar9 = internal::LogMessage::operator<<(pLVar9,"\".");
        internal::LogFinisher::operator=((LogFinisher *)&local_d8,pLVar9);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      internal::LogMessage::~LogMessage((LogMessage *)local_130);
      bVar14 = false;
    }
LAB_0038b23e:
    if (bVar14) {
      _Var10 = std::
               __upper_bound<__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_const*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>>>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare>>
                         ((this->by_symbol_flat_).
                          super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->by_symbol_flat_).
                          super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
                          ._M_impl.super__Vector_impl_data._M_finish,&local_58,
                          (_Val_comp_iter<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare>
                           )(this->by_symbol_)._M_t._M_impl.
                            super__Rb_tree_key_compare<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare>
                            ._M_key_compare.index);
      local_d8.ptr_ = local_98._M_dataplus._M_p;
      this_01._M_current = _Var10._M_current + -1;
      if (_Var10._M_current ==
          (this->by_symbol_flat_).
          super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        this_01 = _Var10;
      }
      if ((long)local_98._M_string_length < 0) {
        stringpiece_internal::StringPiece::LogFatalSizeTooBig
                  (local_98._M_string_length,"string length exceeds max size");
      }
      pSVar3 = (this->by_symbol_flat_).
               super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_d8.length_ = local_98._M_string_length;
      bVar14 = true;
      if (this_01._M_current != pSVar3) {
        SymbolEntry::AsString_abi_cxx11_((string *)local_130,this_01._M_current,this);
        sub_symbol_00.length_ = local_130._8_8_;
        sub_symbol_00.ptr_ = (char *)local_130._0_8_;
        if ((long)local_130._8_8_ < 0) {
          stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    (local_130._8_8_,"string length exceeds max size");
        }
        super_symbol_00.length_ = local_d8.length_;
        super_symbol_00.ptr_ = local_d8.ptr_;
        bVar8 = anon_unknown_31::IsSubSymbol(sub_symbol_00,super_symbol_00);
        if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
          operator_delete((void *)local_130._0_8_);
        }
        if (bVar8) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_130,LOGLEVEL_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
                     ,0x29c);
          pLVar9 = internal::LogMessage::operator<<((LogMessage *)local_130,"Symbol name \"");
          pLVar9 = internal::LogMessage::operator<<(pLVar9,&local_d8);
          pLVar9 = internal::LogMessage::operator<<
                             (pLVar9,"\" conflicts with the existing symbol \"");
          SymbolEntry::AsString_abi_cxx11_(&local_f8,this_01._M_current,this);
          pLVar9 = internal::LogMessage::operator<<(pLVar9,&local_f8);
          pLVar9 = internal::LogMessage::operator<<(pLVar9,"\".");
          internal::LogFinisher::operator=((LogFinisher *)&local_c0,pLVar9);
          psVar5 = &local_f8;
        }
        else {
          this_02 = this_01._M_current + 1;
          if (this_02 == pSVar3) {
            bVar8 = false;
          }
          else {
            local_c8 = local_d8.ptr_;
            local_a0 = (char *)local_d8.length_;
            SymbolEntry::AsString_abi_cxx11_(&local_f8,this_02,this);
            super_symbol.length_ = local_f8._M_string_length;
            super_symbol.ptr_ = local_f8._M_dataplus._M_p;
            if ((long)local_f8._M_string_length < 0) {
              stringpiece_internal::StringPiece::LogFatalSizeTooBig
                        (local_f8._M_string_length,"string length exceeds max size");
            }
            sub_symbol_02.length_ = (size_type)local_a0;
            sub_symbol_02.ptr_ = local_c8;
            bVar8 = anon_unknown_31::IsSubSymbol(sub_symbol_02,super_symbol);
          }
          if ((this_02 != pSVar3) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2)) {
            operator_delete(local_f8._M_dataplus._M_p);
          }
          if (bVar8 == false) goto LAB_0038b528;
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_130,LOGLEVEL_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
                     ,0x2aa);
          pLVar9 = internal::LogMessage::operator<<((LogMessage *)local_130,"Symbol name \"");
          pLVar9 = internal::LogMessage::operator<<(pLVar9,&local_d8);
          pLVar9 = internal::LogMessage::operator<<
                             (pLVar9,"\" conflicts with the existing symbol \"");
          SymbolEntry::AsString_abi_cxx11_(&local_c0,this_02,this);
          pLVar9 = internal::LogMessage::operator<<(pLVar9,&local_c0);
          pLVar9 = internal::LogMessage::operator<<(pLVar9,"\".");
          internal::LogFinisher::operator=(&local_131,pLVar9);
          psVar5 = &local_c0;
        }
        puVar4 = *(undefined1 **)((psVar5->field_2)._M_local_buf + -0x10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar4 != &psVar5->field_2) {
          operator_delete(puVar4);
        }
        internal::LogMessage::~LogMessage((LogMessage *)local_130);
        bVar14 = false;
      }
LAB_0038b528:
      if (bVar14) {
        local_130._0_8_ = this_00;
        std::
        _Rb_tree<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,std::_Identity<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>>
        ::
        _M_insert_unique_<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_const&,std::_Rb_tree<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,std::_Identity<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>>::_Alloc_node>
                  ((_Rb_tree<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,std::_Identity<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>>
                    *)this_00,__position,&local_58,(_Alloc_node *)local_130);
      }
      goto LAB_0038b39f;
    }
  }
  else {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_130,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
               ,0x2bf);
    pLVar9 = internal::LogMessage::operator<<((LogMessage *)local_130,"Invalid symbol name: ");
    pLVar9 = internal::LogMessage::operator<<(pLVar9,&local_98);
    internal::LogFinisher::operator=((LogFinisher *)&local_f8,pLVar9);
    internal::LogMessage::~LogMessage((LogMessage *)local_130);
  }
  bVar14 = false;
LAB_0038b39f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.encoded_symbol._M_dataplus._M_p != &local_58.encoded_symbol.field_2) {
    operator_delete(local_58.encoded_symbol._M_dataplus._M_p);
  }
  return bVar14;
}

Assistant:

bool EncodedDescriptorDatabase::DescriptorIndex::AddSymbol(
    StringPiece symbol) {
  SymbolEntry entry = {static_cast<int>(all_values_.size() - 1),
                       EncodeString(symbol)};
  std::string entry_as_string = entry.AsString(*this);

  // We need to make sure not to violate our map invariant.

  // If the symbol name is invalid it could break our lookup algorithm (which
  // relies on the fact that '.' sorts before all other characters that are
  // valid in symbol names).
  if (!ValidateSymbolName(symbol)) {
    GOOGLE_LOG(ERROR) << "Invalid symbol name: " << entry_as_string;
    return false;
  }

  auto iter = FindLastLessOrEqual(&by_symbol_, entry);
  if (!CheckForMutualSubsymbols(entry_as_string, &iter, by_symbol_.end(),
                                *this)) {
    return false;
  }

  // Same, but on by_symbol_flat_
  auto flat_iter =
      FindLastLessOrEqual(&by_symbol_flat_, entry, by_symbol_.key_comp());
  if (!CheckForMutualSubsymbols(entry_as_string, &flat_iter,
                                by_symbol_flat_.end(), *this)) {
    return false;
  }

  // OK, no conflicts.

  // Insert the new symbol using the iterator as a hint, the new entry will
  // appear immediately before the one the iterator is pointing at.
  by_symbol_.insert(iter, entry);

  return true;
}